

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.hpp
# Opt level: O3

void __thiscall openjij::utility::Xorshift::Xorshift(Xorshift *this)

{
  uint uVar1;
  random_device rd;
  random_device rStack_1398;
  
  this->x = 0x75bcd15;
  this->y = 0x159a55e5;
  this->z = 0x1f123bb5;
  std::random_device::random_device(&rStack_1398);
  uVar1 = std::random_device::_M_getval();
  this->w = uVar1;
  std::random_device::_M_fini();
  return;
}

Assistant:

Xorshift() {
    std::random_device rd;
    w = rd();
  }